

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

uint xmrig::Json::getUint(Value *obj,char *key,uint defaultValue)

{
  ConstMemberIterator CVar1;
  
  CVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember(obj,key);
  if ((CVar1.ptr_ !=
       (Pointer)((ulong)(obj->data_).s.length * 0x20 + ((ulong)(obj->data_).s.str & 0xffffffffffff))
      ) && ((undefined1  [16])
            ((undefined1  [16])((CVar1.ptr_)->value).data_ & (undefined1  [16])0x40000000000000) !=
            (undefined1  [16])0x0)) {
    defaultValue = ((CVar1.ptr_)->value).data_.s.length;
  }
  return defaultValue;
}

Assistant:

unsigned xmrig::Json::getUint(const rapidjson::Value &obj, const char *key, unsigned defaultValue)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsUint()) {
        return i->value.GetUint();
    }

    return defaultValue;
}